

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrint(char *string)

{
  byte bVar1;
  uint __c;
  char *pch;
  
  if (string != (char *)0x0) {
    for (; bVar1 = *string, bVar1 != 0; string = (char *)((byte *)string + 1)) {
      if ((byte)(bVar1 - 0x20) < 0x5f) {
        __c = (uint)bVar1;
LAB_00105de1:
        putchar(__c);
      }
      else {
        putchar(0x5c);
        if (bVar1 == 10) {
          __c = 0x6e;
          goto LAB_00105de1;
        }
        if (bVar1 == 0xd) {
          __c = 0x72;
          goto LAB_00105de1;
        }
        putchar(0x78);
        UnityPrintNumberHex((long)*string,'\x02');
      }
    }
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
#ifdef UNITY_OUTPUT_COLOR
            /* print ANSI escape code */
            else if (*pch == 27 && *(pch + 1) == '[')
            {
                while (*pch && *pch != 'm')
                {
                    UNITY_OUTPUT_CHAR(*pch);
                    pch++;
                }
                UNITY_OUTPUT_CHAR('m');
            }
#endif
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)*pch, 2);
            }
            pch++;
        }
    }
}